

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::IsPropertyUnscopable(Var instanceVar,PropertyId propertyId)

{
  ScriptContext *requestContext;
  BOOL BVar1;
  RecyclableObject *propertyObject;
  Var instance;
  DynamicObject *propertyObject_00;
  Var local_28;
  Var value;
  
  propertyObject = VarTo<Js::RecyclableObject>(instanceVar);
  requestContext =
       (((((propertyObject->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  instance = GetProperty(propertyObject,propertyObject,0x1c,requestContext,(PropertyValueInfo *)0x0)
  ;
  BVar1 = IsObject(instance);
  if (BVar1 != 0) {
    propertyObject_00 = VarTo<Js::DynamicObject>(instance);
    local_28 = (Var)0x0;
    BVar1 = GetProperty_Internal<false>
                      (propertyObject_00,&propertyObject_00->super_RecyclableObject,false,propertyId
                       ,&local_28,requestContext,(PropertyValueInfo *)0x0);
    if (BVar1 != 0) {
      BVar1 = JavascriptConversion::ToBoolean(local_28,requestContext);
      return BVar1;
    }
  }
  return 0;
}

Assistant:

BOOL JavascriptOperators::IsPropertyUnscopable(Var instanceVar, PropertyId propertyId)
    {
        RecyclableObject* instance = VarTo<RecyclableObject>(instanceVar);
        ScriptContext * scriptContext = instance->GetScriptContext();

        Var unscopables = JavascriptOperators::GetProperty(instance, PropertyIds::_symbolUnscopables, scriptContext);
        if (JavascriptOperators::IsObject(unscopables))
        {
            DynamicObject *unscopablesList = VarTo<DynamicObject>(unscopables);
            Var value = nullptr;
            //8.1.1.2.1.9.c If blocked is not undefined
            if (JavascriptOperators::GetProperty(unscopablesList, propertyId, &value, scriptContext))
            {
                return JavascriptConversion::ToBoolean(value, scriptContext);
            }
        }

        return false;
    }